

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

void mi_option_enable(mi_option_t option)

{
  mi_option_set(option,1);
  return;
}

Assistant:

void mi_option_enable(mi_option_t option) {
  mi_option_set_enabled(option,true);
}